

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

void __thiscall SQVM::FindOuter(SQVM *this,SQObjectPtr *target,SQObjectPtr *stackindex)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQSharedState *ss;
  SQUnsignedInteger SVar3;
  SQObjectValue SVar4;
  SQTable *pSVar5;
  SQObjectValue *pSVar6;
  SQObjectPtr local_40;
  
  pSVar6 = (SQObjectValue *)&this->_openouters;
  SVar4 = (SQObjectValue)this->_openouters;
  if (((SQOuter *)SVar4.pTable != (SQOuter *)0x0) &&
     (pSVar5 = ((SVar4.pTable)->super_SQDelegable)._delegate, stackindex <= pSVar5)) {
    do {
      local_40.super_SQObject._unVal = SVar4;
      if (pSVar5 == (SQTable *)stackindex) {
        local_40.super_SQObject._type = OT_OUTER;
        pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        pSVar5 = (target->super_SQObject)._unVal.pTable;
        (target->super_SQObject)._unVal.pTable = (SQTable *)local_40.super_SQObject._unVal;
        SVar2 = (target->super_SQObject)._type;
        (target->super_SQObject)._type = OT_OUTER;
        pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
        goto LAB_0012c02d;
      }
      SVar4 = (SQObjectValue)(local_40.super_SQObject._unVal.pOuter)->_next;
    } while (((SQOuter *)SVar4.pTable != (SQOuter *)0x0) &&
            (pSVar5 = ((SVar4.pTable)->super_SQDelegable)._delegate, stackindex <= pSVar5));
    pSVar6 = (SQObjectValue *)&(local_40.super_SQObject._unVal.pOuter)->_next;
  }
  ss = this->_sharedstate;
  SVar4.pUserPointer = sq_vm_malloc(0x58);
  SQOuter::SQOuter(SVar4.pOuter,ss,stackindex);
  (SVar4.pTable)->_usednodes = (SQInteger)*(SQOuter **)pSVar6;
  (SVar4.pOuter)->_idx = (long)stackindex - (long)(this->_stack)._vals >> 4;
  SVar3 = (SVar4.pRefCounted)->_uiRef;
  pSVar6->pOuter = (SQOuter *)SVar4;
  local_40.super_SQObject._type = OT_OUTER;
  ((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = SVar3 + 2;
  pSVar5 = (target->super_SQObject)._unVal.pTable;
  (target->super_SQObject)._unVal.pOuter = (SQOuter *)SVar4;
  SVar2 = (target->super_SQObject)._type;
  (target->super_SQObject)._type = OT_OUTER;
  pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_40.super_SQObject._unVal.pUserPointer = SVar4.pUserPointer;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
LAB_0012c02d:
  SQObjectPtr::~SQObjectPtr(&local_40);
  return;
}

Assistant:

void SQVM::FindOuter(SQObjectPtr &target, SQObjectPtr *stackindex)
{
    SQOuter **pp = &_openouters;
    SQOuter *p;
    SQOuter *otr;

    while ((p = *pp) != NULL && p->_valptr >= stackindex) {
        if (p->_valptr == stackindex) {
            target = SQObjectPtr(p);
            return;
        }
        pp = &p->_next;
    }
    otr = SQOuter::Create(_ss(this), stackindex);
    otr->_next = *pp;
    otr->_idx  = (stackindex - _stack._vals);
    __ObjAddRef(otr);
    *pp = otr;
    target = SQObjectPtr(otr);
}